

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O3

int Gia_ManAppendAnd2(Gia_Man_t *p,int iLit0,int iLit1)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  Gia_Obj_t *pFanout;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (p->fGiaSimple == 0) {
    if (iLit0 < 2) {
      if (iLit0 != 0) {
        return iLit1;
      }
      return 0;
    }
    if (iLit1 < 2) {
      if (iLit1 != 0) {
        return iLit0;
      }
      return 0;
    }
    if (iLit0 == iLit1) {
      return iLit0;
    }
    if ((iLit1 ^ iLit0) == 1) {
      return 0;
    }
    pFanout = Gia_ManAppendObj(p);
  }
  else {
    pFanout = Gia_ManAppendObj(p);
    if (iLit0 < 0) goto LAB_0067a4e1;
  }
  uVar4 = (uint)iLit0 >> 1;
  uVar1 = p->nObjs;
  if ((int)uVar1 <= (int)uVar4) {
LAB_0067a4e1:
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x2a8,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  if ((iLit1 < 0) || (uVar3 = (uint)iLit1 >> 1, uVar1 <= uVar3)) {
    __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  if ((uVar4 == uVar3) && (p->fGiaSimple == 0)) {
    __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
  }
  pGVar2 = p->pObjs;
  iVar5 = (int)pFanout;
  if ((uint)iLit0 < (uint)iLit1) {
    if (pGVar2 + uVar1 <= pFanout || pFanout < pGVar2) goto LAB_0067a4a3;
    uVar9 = *(ulong *)pFanout;
    uVar6 = (ulong)((iLit0 & 1U) << 0x1d |
                   ((uint)(iVar5 - (int)pGVar2) >> 2) * -0x55555555 - uVar4 & 0x1fffffff);
    *(ulong *)pFanout = uVar6 | uVar9 & 0xffffffffc0000000;
    pGVar2 = p->pObjs;
    if ((pFanout < pGVar2) || (pGVar2 + p->nObjs <= pFanout)) goto LAB_0067a4a3;
    uVar9 = (ulong)(iLit1 & 1) << 0x3d |
            uVar6 | uVar9 & 0xc0000000c0000000 |
            (ulong)(((uint)(iVar5 - (int)pGVar2) >> 2) * -0x55555555 - uVar3 & 0x1fffffff) << 0x20;
  }
  else {
    if (pGVar2 + uVar1 <= pFanout || pFanout < pGVar2) goto LAB_0067a4a3;
    uVar9 = *(ulong *)pFanout;
    uVar6 = (ulong)(((uint)(iVar5 - (int)pGVar2) >> 2) * -0x55555555 - uVar4 & 0x1fffffff) << 0x20;
    uVar7 = (ulong)(iLit0 & 1) << 0x3d;
    *(ulong *)pFanout = uVar7 | uVar9 & 0xc0000000ffffffff | uVar6;
    pGVar2 = p->pObjs;
    if ((pFanout < pGVar2) || (pGVar2 + p->nObjs <= pFanout)) goto LAB_0067a4a3;
    uVar9 = (ulong)((iLit1 & 1U) << 0x1d) | uVar7 | uVar9 & 0xc0000000c0000000 | uVar6 |
            (ulong)(((uint)(iVar5 - (int)pGVar2) >> 2) * -0x55555555 - uVar3 & 0x1fffffff);
  }
  *(ulong *)pFanout = uVar9;
  if (p->pFanData != (int *)0x0) {
    Gia_ObjAddFanout(p,pFanout + -(uVar9 & 0x1fffffff),pFanout);
    Gia_ObjAddFanout(p,pFanout + -((ulong)*(uint *)&pFanout->field_0x4 & 0x1fffffff),pFanout);
  }
  if (p->fSweeper != 0) {
    uVar6 = *(ulong *)pFanout & 0x1fffffff;
    uVar9 = *(ulong *)pFanout >> 0x20 & 0x1fffffff;
    uVar7 = 0x4000000000000000;
    uVar8 = 0x4000000000000000;
    if (((uint)*(ulong *)(pFanout + -uVar6) >> 0x1e & 1) == 0) {
      uVar8 = 0x40000000;
    }
    *(ulong *)(pFanout + -uVar6) = uVar8 | *(ulong *)(pFanout + -uVar6);
    uVar8 = *(ulong *)(pFanout + -uVar9);
    if (((uint)uVar8 >> 0x1e & 1) == 0) {
      uVar7 = 0x40000000;
    }
    *(ulong *)(pFanout + -uVar9) = uVar7 | uVar8;
    uVar9 = *(ulong *)pFanout;
    *(ulong *)pFanout =
         uVar9 & 0x7fffffffffffffff |
         (ulong)(((uint)(uVar9 >> 0x3d) ^ (uint)(uVar8 >> 0x3f)) &
                ((uint)((ulong)*(undefined8 *)(pFanout + -uVar6) >> 0x3f) ^
                (uint)(uVar9 >> 0x1d) & 7)) << 0x3f;
  }
  if (p->fBuiltInSim != 0) {
    uVar9 = *(ulong *)pFanout;
    *(ulong *)pFanout =
         uVar9 & 0x7fffffffffffffff |
         (ulong)(((uint)(uVar9 >> 0x3d) ^
                 (uint)((ulong)*(undefined8 *)(pFanout + -(uVar9 >> 0x20 & 0x1fffffff)) >> 0x3f)) &
                ((uint)((ulong)*(undefined8 *)(pFanout + -(uVar9 & 0x1fffffff)) >> 0x3f) ^
                (uint)(uVar9 >> 0x1d) & 7)) << 0x3f;
    pGVar2 = p->pObjs;
    if ((pFanout < pGVar2) || (pGVar2 + p->nObjs <= pFanout)) goto LAB_0067a4a3;
    Gia_ManBuiltInSimPerform(p,(int)((ulong)((long)pFanout - (long)pGVar2) >> 2) * -0x55555555);
  }
  if (p->vSuppWords != (Vec_Wrd_t *)0x0) {
    Gia_ManQuantSetSuppAnd(p,pFanout);
  }
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pFanout) && (pFanout < pGVar2 + p->nObjs)) {
    return (int)((ulong)((long)pFanout - (long)pGVar2) >> 2) * 0x55555556;
  }
LAB_0067a4a3:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline int Gia_ManAppendAnd2( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    if ( !p->fGiaSimple )
    {
        if ( iLit0 < 2 )
            return iLit0 ? iLit1 : 0;
        if ( iLit1 < 2 )
            return iLit1 ? iLit0 : 0;
        if ( iLit0 == iLit1 )
            return iLit1;
        if ( iLit0 == Abc_LitNot(iLit1) )
            return 0;
    }
    return Gia_ManAppendAnd( p, iLit0, iLit1 );
}